

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::FindNameOfFileContainingSymbol
          (EncodedDescriptorDatabase *this,string *symbol_name,string *output)

{
  uint32 uVar1;
  MessageFactory *buffer;
  string *psVar2;
  pair<const_void_*,_int> pVar3;
  undefined1 local_190 [8];
  FileDescriptorProto file_proto;
  undefined1 local_a8 [4];
  uint32 kNameTag;
  CodedInputStream input;
  pair<const_void_*,_int> encoded_file;
  string *output_local;
  string *symbol_name_local;
  EncodedDescriptorDatabase *this_local;
  
  pVar3 = SimpleDescriptorDatabase::DescriptorIndex<std::pair<const_void_*,_int>_>::FindSymbol
                    (&this->index_,symbol_name);
  buffer = (MessageFactory *)pVar3.first;
  if (buffer == (MessageFactory *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    input.extension_factory_ = buffer;
    io::CodedInputStream::CodedInputStream
              ((CodedInputStream *)local_a8,(uint8 *)buffer,pVar3.second);
    uVar1 = internal::WireFormatLite::MakeTag(1,WIRETYPE_LENGTH_DELIMITED);
    if ((input.input_ < input.buffer_) &&
       (*(byte *)&(input.input_)->_vptr_ZeroCopyInputStream < 0x80)) {
      input.total_bytes_read_ = (int)*(byte *)&(input.input_)->_vptr_ZeroCopyInputStream;
      io::CodedInputStream::Advance((CodedInputStream *)local_a8,1);
    }
    else {
      input.total_bytes_read_ = io::CodedInputStream::ReadTagFallback((CodedInputStream *)local_a8);
    }
    if (input.total_bytes_read_ == uVar1) {
      this_local._7_1_ = internal::WireFormatLite::ReadString((CodedInputStream *)local_a8,output);
      file_proto._cached_size_ = 1;
    }
    else {
      FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_190);
      this_local._7_1_ = MessageLite::ParseFromArray((MessageLite *)local_190,buffer,pVar3.second);
      if (this_local._7_1_) {
        psVar2 = FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)local_190);
        std::__cxx11::string::operator=((string *)output,(string *)psVar2);
      }
      file_proto._cached_size_ = 1;
      FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_190);
    }
    io::CodedInputStream::~CodedInputStream((CodedInputStream *)local_a8);
  }
  return this_local._7_1_;
}

Assistant:

bool EncodedDescriptorDatabase::FindNameOfFileContainingSymbol(
    const string& symbol_name,
    string* output) {
  pair<const void*, int> encoded_file = index_.FindSymbol(symbol_name);
  if (encoded_file.first == NULL) return false;

  // Optimization:  The name should be the first field in the encoded message.
  //   Try to just read it directly.
  io::CodedInputStream input(reinterpret_cast<const uint8*>(encoded_file.first),
                             encoded_file.second);

  const uint32 kNameTag = internal::WireFormatLite::MakeTag(
      FileDescriptorProto::kNameFieldNumber,
      internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED);

  if (input.ReadTag() == kNameTag) {
    // Success!
    return internal::WireFormatLite::ReadString(&input, output);
  } else {
    // Slow path.  Parse whole message.
    FileDescriptorProto file_proto;
    if (!file_proto.ParseFromArray(encoded_file.first, encoded_file.second)) {
      return false;
    }
    *output = file_proto.name();
    return true;
  }
}